

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void ImGui::PopItemWidth(void)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  int iVar3;
  float *pfVar4;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  iVar1 = (pIVar2->DC).ItemWidthStack.Size;
  iVar3 = iVar1 + -1;
  (pIVar2->DC).ItemWidthStack.Size = iVar3;
  if (iVar3 == 0) {
    pfVar4 = &pIVar2->ItemWidthDefault;
  }
  else {
    pfVar4 = (pIVar2->DC).ItemWidthStack.Data + (long)iVar1 + -2;
  }
  (pIVar2->DC).ItemWidth = *pfVar4;
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }